

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *window;
  ImGuiID id;
  float *pfVar5;
  size_t idx;
  uint flags;
  ImRect bb;
  ImRect local_40;
  
  window = GImGui->CurrentWindow;
  id = GetWindowScrollbarID(window,axis);
  KeepAliveID(id);
  local_40 = GetWindowScrollbarRect(window,axis);
  if (axis == ImGuiAxis_X) {
    flags = (window->ScrollbarY ^ 1) << 7 | 0x140;
  }
  else {
    flags = (window->ScrollbarX ^ 1) * 0x80 + (uint)((window->Flags & 0x401U) == 1) * 0x20 + 0x100;
  }
  idx = (size_t)axis;
  pfVar5 = ImVec2::operator[](&(window->InnerRect).Max,idx);
  fVar1 = *pfVar5;
  pfVar5 = ImVec2::operator[](&(window->InnerRect).Min,idx);
  fVar2 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->ContentSize,idx);
  fVar3 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->WindowPadding,idx);
  fVar4 = *pfVar5;
  pfVar5 = ImVec2::operator[](&window->Scroll,idx);
  ScrollbarEx(&local_40,id,axis,pfVar5,fVar1 - fVar2,fVar4 + fVar4 + fVar3,flags);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}